

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O2

bool __thiscall S2Polyline::Intersects(S2Polyline *this,S2Polyline *line)

{
  bool bVar1;
  int iVar2;
  S2Point *pSVar3;
  S2Point *b;
  S2Point *c;
  int j;
  int k;
  int i;
  int k_00;
  S2LatLngRect SStack_c8;
  S2EdgeCrosser crosser;
  
  if (this->num_vertices_ < 1) {
    return false;
  }
  if (0 < line->num_vertices_) {
    GetRectBound((S2LatLngRect *)&crosser,this);
    GetRectBound(&SStack_c8,line);
    bVar1 = S2LatLngRect::Intersects((S2LatLngRect *)&crosser,&SStack_c8);
    if (bVar1) {
      for (k_00 = 1; k_00 < this->num_vertices_; k_00 = k_00 + 1) {
        pSVar3 = vertex(this,k_00 + -1);
        b = vertex(this,k_00);
        c = vertex(line,0);
        S2EdgeCrosser::S2EdgeCrosser(&crosser,pSVar3,b,c);
        k = 1;
        while (k < line->num_vertices_) {
          pSVar3 = vertex(line,k);
          iVar2 = S2EdgeCrosser::CrossingSign(&crosser,pSVar3);
          k = k + 1;
          if (-1 < iVar2) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool S2Polyline::Intersects(const S2Polyline* line) const {
  if (num_vertices() <= 0 || line->num_vertices() <= 0) {
    return false;
  }

  if (!GetRectBound().Intersects(line->GetRectBound())) {
    return false;
  }

  // TODO(ericv): Use S2ShapeIndex here.
  for (int i = 1; i < num_vertices(); ++i) {
    S2EdgeCrosser crosser(
        &vertex(i - 1), &vertex(i), &line->vertex(0));
    for (int j = 1; j < line->num_vertices(); ++j) {
      if (crosser.CrossingSign(&line->vertex(j)) >= 0) {
        return true;
      }
    }
  }
  return false;
}